

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

void reversed_copy(int N,v4sf *in,int in_stride,v4sf *out)

{
  v4sf tmp___1;
  v4sf h1;
  v4sf h0;
  v4sf tmp__;
  int local_cc;
  int k;
  v4sf g1;
  v4sf g0;
  v4sf *out_local;
  v4sf *pafStack_98;
  int in_stride_local;
  v4sf *in_local;
  undefined4 uStack_88;
  int N_local;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 local_68;
  float fStack_64;
  undefined4 local_58;
  float fStack_54;
  undefined4 uStack_40;
  float fStack_3c;
  undefined4 uStack_30;
  float fStack_2c;
  float fStack_20;
  float fStack_1c;
  float fStack_c;
  
  local_58 = (undefined4)*(undefined8 *)*in;
  fStack_54 = (float)((ulong)*(undefined8 *)*in >> 0x20);
  local_68 = (undefined4)*(undefined8 *)in[1];
  fStack_64 = (float)((ulong)*(undefined8 *)in[1] >> 0x20);
  fStack_c = (float)((ulong)*(undefined8 *)(*in + 2) >> 0x20);
  fStack_20 = (float)*(undefined8 *)(in[1] + 2);
  fStack_1c = (float)((ulong)*(undefined8 *)(in[1] + 2) >> 0x20);
  g1[0] = fStack_c;
  g1[1] = fStack_1c;
  pafStack_98 = in + in_stride;
  out[-1][0] = (float)*(undefined8 *)(*in + 2);
  out[-1][1] = fStack_20;
  out[-1][2] = fStack_54;
  out[-1][3] = fStack_64;
  g0._8_8_ = out + -1;
  for (local_cc = 1; local_cc < N; local_cc = local_cc + 1) {
    local_78 = (undefined4)*(undefined8 *)*pafStack_98;
    uStack_74 = (undefined4)((ulong)*(undefined8 *)*pafStack_98 >> 0x20);
    uStack_88 = (undefined4)*(undefined8 *)pafStack_98[1];
    N_local = (int)((ulong)*(undefined8 *)pafStack_98[1] >> 0x20);
    uStack_30 = (undefined4)*(undefined8 *)(*pafStack_98 + 2);
    fStack_2c = (float)((ulong)*(undefined8 *)(*pafStack_98 + 2) >> 0x20);
    uStack_40 = (undefined4)*(undefined8 *)(pafStack_98[1] + 2);
    fStack_3c = (float)((ulong)*(undefined8 *)(pafStack_98[1] + 2) >> 0x20);
    pafStack_98 = pafStack_98 + in_stride;
    *(undefined4 *)(g0._8_8_ + -0x10) = local_78;
    *(undefined4 *)(g0._8_8_ + -0xc) = uStack_88;
    *(float *)(g0._8_8_ + -8) = g1[0];
    *(float *)(g0._8_8_ + -4) = g1[1];
    *(undefined4 *)(g0._8_8_ + -0x20) = uStack_30;
    *(undefined4 *)(g0._8_8_ + -0x1c) = uStack_40;
    *(undefined4 *)(g0._8_8_ + -0x18) = uStack_74;
    *(int *)(g0._8_8_ + -0x14) = N_local;
    g1[0] = fStack_2c;
    g1[1] = fStack_3c;
    g0._8_8_ = g0._8_8_ + -0x20;
  }
  *(undefined4 *)(g0._8_8_ + -0x10) = local_58;
  *(undefined4 *)(g0._8_8_ + -0xc) = local_68;
  *(float *)(g0._8_8_ + -8) = g1[0];
  *(float *)(g0._8_8_ + -4) = g1[1];
  return;
}

Assistant:

static void reversed_copy(int N, const v4sf *in, int in_stride, v4sf *out) {
  v4sf g0, g1;
  int k;
  INTERLEAVE2(in[0], in[1], g0, g1); in += in_stride;
  
  *--out = VSWAPHL(g0, g1); // [g0l, g0h], [g1l g1h] -> [g1l, g0h]
  for (k=1; k < N; ++k) {
    v4sf h0, h1;
    INTERLEAVE2(in[0], in[1], h0, h1); in += in_stride;
    *--out = VSWAPHL(g1, h0);
    *--out = VSWAPHL(h0, h1);
    g1 = h1;
  }
  *--out = VSWAPHL(g1, g0);
}